

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::ByteSizeLong
          (RandomUniformStaticLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  int value;
  
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar1 == 0) {
    value = 0;
    lVar3 = 0;
  }
  else {
    value = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar3 = sVar2 + 1;
  }
  this->_outputshape_cached_byte_size_ = value;
  sVar1 = lVar3 + sVar1;
  if (this->seed_ != 0) {
    uVar4 = this->seed_ | 1;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar1 = sVar1 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = sVar1;
  if (this->minval_ != 0.0) {
    sVar2 = sVar1 + 5;
  }
  if (NAN(this->minval_)) {
    sVar2 = sVar1 + 5;
  }
  sVar1 = sVar2;
  if (this->maxval_ != 0.0) {
    sVar1 = sVar2 + 5;
  }
  if (NAN(this->maxval_)) {
    sVar1 = sVar2 + 5;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t RandomUniformStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RandomUniformStaticLayerParams)
  size_t total_size = 0;

  // repeated uint64 outputShape = 4;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // int64 seed = 1;
  if (this->seed() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->seed());
  }

  // float minVal = 2;
  if (this->minval() != 0) {
    total_size += 1 + 4;
  }

  // float maxVal = 3;
  if (this->maxval() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}